

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Relations.cpp
# Opt level: O0

Relations dg::vr::compose(Relations *lt,Relations *rt)

{
  bool bVar1;
  const_iterator pvVar2;
  const_iterator pvVar3;
  const_iterator pvVar4;
  Relations *pRVar5;
  _WordT *in_RSI;
  _WordT *in_RDI;
  Type rtRel;
  const_iterator __end3;
  const_iterator __begin3;
  array<dg::vr::Relations::Type,_12UL> *__range3;
  Type ltRel;
  const_iterator __end2;
  const_iterator __begin2;
  array<dg::vr::Relations::Type,_12UL> *__range2;
  Relations result;
  undefined1 in_stack_ffffffffffffff9b;
  Type in_stack_ffffffffffffff9c;
  Type in_stack_ffffffffffffffa0;
  value_type in_stack_ffffffffffffffa4;
  const_iterator local_30;
  bitset<12UL> local_8;
  
  bVar1 = Relations::has((Relations *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                         in_stack_ffffffffffffff9c);
  if (bVar1) {
    local_8.super__Base_bitset<1UL>._M_w = (_Base_bitset<1UL>)*in_RSI;
  }
  else {
    bVar1 = Relations::has((Relations *)
                           CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                           in_stack_ffffffffffffff9c);
    if (bVar1) {
      local_8.super__Base_bitset<1UL>._M_w = (_Base_bitset<1UL>)*in_RDI;
    }
    else {
      Relations::Relations((Relations *)0x102d50);
      local_30 = std::array<dg::vr::Relations::Type,_12UL>::begin
                           ((array<dg::vr::Relations::Type,_12UL> *)0x102d68);
      pvVar2 = std::array<dg::vr::Relations::Type,_12UL>::end
                         ((array<dg::vr::Relations::Type,_12UL> *)0x102d79);
      for (; local_30 != pvVar2; local_30 = local_30 + 1) {
        bVar1 = Relations::has((Relations *)
                               CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                               in_stack_ffffffffffffff9c);
        if (bVar1) {
          pvVar3 = std::array<dg::vr::Relations::Type,_12UL>::begin
                             ((array<dg::vr::Relations::Type,_12UL> *)0x102dc8);
          pvVar4 = std::array<dg::vr::Relations::Type,_12UL>::end
                             ((array<dg::vr::Relations::Type,_12UL> *)0x102dd9);
          for (; pvVar3 != pvVar4; pvVar3 = pvVar3 + 1) {
            in_stack_ffffffffffffffa4 = *pvVar3;
            bVar1 = Relations::has((Relations *)
                                   CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                                   in_stack_ffffffffffffff9c);
            if ((bVar1) &&
               (bVar1 = Relations::transitiveOver((Type)pvVar3,(Type)((ulong)pvVar4 >> 0x20)), bVar1
               )) {
              bVar1 = Relations::isStrict(EQ);
              if ((bVar1) || (bVar1 = Relations::isStrict(EQ), bVar1)) {
                Relations::getStrict(in_stack_ffffffffffffffa0);
                Relations::set((Relations *)
                               CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                               in_stack_ffffffffffffff9c,(bool)in_stack_ffffffffffffff9b);
              }
              else {
                Relations::set((Relations *)
                               CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                               in_stack_ffffffffffffff9c,(bool)in_stack_ffffffffffffff9b);
              }
            }
          }
        }
      }
      pRVar5 = Relations::addImplied
                         ((Relations *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)
                         );
      local_8.super__Base_bitset<1UL>._M_w =
           (_Base_bitset<1UL>)(pRVar5->bits).super__Base_bitset<1UL>._M_w;
    }
  }
  return (Relations)local_8.super__Base_bitset<1UL>._M_w._M_w;
}

Assistant:

Relations compose(const Relations &lt, const Relations &rt) {
    if (lt.has(Relations::EQ))
        return rt;
    if (rt.has(Relations::EQ))
        return lt;
    Relations result;
    for (Relations::Type ltRel : Relations::all) {
        if (!lt.has(ltRel))
            continue;

        for (Relations::Type rtRel : Relations::all) {
            if (rt.has(rtRel) && Relations::transitiveOver(ltRel, rtRel)) {
                if (Relations::isStrict(ltRel) || Relations::isStrict(rtRel))
                    result.set(Relations::getStrict(ltRel));
                else
                    result.set(ltRel);
            }
        }
    }
    return result.addImplied();
}